

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O1

int amqp_time_tv_until(amqp_time_t time,timeval *in,timeval **out)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  timespec tp;
  timespec local_30;
  
  if (time.time_point_ns == 0xffffffffffffffff) {
    in = (timeval *)0x0;
  }
  else {
    if (time.time_point_ns != 0) {
      iVar1 = clock_gettime(1,&local_30);
      if (iVar1 == -1) {
        uVar2 = 0;
      }
      else {
        uVar2 = local_30.tv_sec * 1000000000 + local_30.tv_nsec;
      }
      if (uVar2 == 0) {
        return -0xe;
      }
      uVar3 = time.time_point_ns - uVar2;
      if (uVar2 <= time.time_point_ns && uVar3 != 0) {
        in->tv_sec = (long)(int)(uVar3 / 1000000000);
        in->tv_usec = (uVar3 % 1000000000) / 1000;
        goto LAB_0010c0b6;
      }
    }
    in->tv_sec = 0;
    in->tv_usec = 0;
  }
LAB_0010c0b6:
  *out = in;
  return 0;
}

Assistant:

int amqp_time_tv_until(amqp_time_t time, struct timeval *in,
                       struct timeval **out) {
  uint64_t now_ns;
  uint64_t delta_ns;

  assert(in != NULL);
  if (UINT64_MAX == time.time_point_ns) {
    *out = NULL;
    return AMQP_STATUS_OK;
  }
  if (0 == time.time_point_ns) {
    in->tv_sec = 0;
    in->tv_usec = 0;
    *out = in;
    return AMQP_STATUS_OK;
  }

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  if (now_ns >= time.time_point_ns) {
    in->tv_sec = 0;
    in->tv_usec = 0;
    *out = in;
    return AMQP_STATUS_OK;
  }

  delta_ns = time.time_point_ns - now_ns;
  in->tv_sec = (int)(delta_ns / AMQP_NS_PER_S);
  in->tv_usec = (int)((delta_ns % AMQP_NS_PER_S) / AMQP_NS_PER_US);
  *out = in;

  return AMQP_STATUS_OK;
}